

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_estimation.c
# Opt level: O2

_Bool aom_compute_global_motion
                (TransformationType type,YV12_BUFFER_CONFIG *src,YV12_BUFFER_CONFIG *ref,
                int bit_depth,GlobalMotionMethod gm_method,int downsample_level,
                MotionModel *motion_models,int num_motion_models,_Bool *mem_alloc_failed)

{
  _Bool _Var1;
  
  if (gm_method == GLOBAL_MOTION_METHOD_DISFLOW) {
    _Var1 = av1_compute_global_motion_disflow
                      (type,src,ref,bit_depth,downsample_level,motion_models,num_motion_models,
                       mem_alloc_failed);
  }
  else if (gm_method == GLOBAL_MOTION_METHOD_FEATURE_MATCH) {
    _Var1 = av1_compute_global_motion_feature_match
                      (type,src,ref,bit_depth,downsample_level,motion_models,num_motion_models,
                       mem_alloc_failed);
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool aom_compute_global_motion(TransformationType type, YV12_BUFFER_CONFIG *src,
                               YV12_BUFFER_CONFIG *ref, int bit_depth,
                               GlobalMotionMethod gm_method,
                               int downsample_level, MotionModel *motion_models,
                               int num_motion_models, bool *mem_alloc_failed) {
  switch (gm_method) {
    case GLOBAL_MOTION_METHOD_FEATURE_MATCH:
      return av1_compute_global_motion_feature_match(
          type, src, ref, bit_depth, downsample_level, motion_models,
          num_motion_models, mem_alloc_failed);
    case GLOBAL_MOTION_METHOD_DISFLOW:
      return av1_compute_global_motion_disflow(
          type, src, ref, bit_depth, downsample_level, motion_models,
          num_motion_models, mem_alloc_failed);
    default: assert(0 && "Unknown global motion estimation type");
  }
  return false;
}